

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int open_get_idle_time_out(OPEN_HANDLE open,milliseconds *idle_time_out_value)

{
  int iVar1;
  AMQP_TYPE AVar2;
  AMQP_VALUE value;
  int get_single_value_result;
  AMQP_VALUE item_value;
  OPEN_INSTANCE *open_instance;
  uint32_t item_count;
  int result;
  milliseconds *idle_time_out_value_local;
  OPEN_HANDLE open_local;
  
  if (open == (OPEN_HANDLE)0x0) {
    open_instance._4_4_ = 0x5b7;
  }
  else {
    _item_count = idle_time_out_value;
    idle_time_out_value_local = (milliseconds *)open;
    iVar1 = amqpvalue_get_composite_item_count(open->composite_value,(uint32_t *)&open_instance);
    if (iVar1 == 0) {
      if ((uint)open_instance < 5) {
        open_instance._4_4_ = 0x5c5;
      }
      else {
        value = amqpvalue_get_composite_item_in_place(open->composite_value,4);
        if ((value == (AMQP_VALUE)0x0) ||
           (AVar2 = amqpvalue_get_type(value), AVar2 == AMQP_TYPE_NULL)) {
          open_instance._4_4_ = 0x5cd;
        }
        else {
          iVar1 = amqpvalue_get_uint(value,_item_count);
          if (iVar1 == 0) {
            open_instance._4_4_ = 0;
          }
          else {
            open_instance._4_4_ = 0x5d4;
          }
        }
      }
    }
    else {
      open_instance._4_4_ = 0x5bf;
    }
  }
  return open_instance._4_4_;
}

Assistant:

int open_get_idle_time_out(OPEN_HANDLE open, milliseconds* idle_time_out_value)
{
    int result;

    if (open == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        uint32_t item_count;
        OPEN_INSTANCE* open_instance = (OPEN_INSTANCE*)open;
        if (amqpvalue_get_composite_item_count(open_instance->composite_value, &item_count) != 0)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (item_count <= 4)
            {
                result = MU_FAILURE;
            }
            else
            {
                AMQP_VALUE item_value = amqpvalue_get_composite_item_in_place(open_instance->composite_value, 4);
                if ((item_value == NULL) ||
                    (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL))
                {
                    result = MU_FAILURE;
                }
                else
                {
                    int get_single_value_result = amqpvalue_get_milliseconds(item_value, idle_time_out_value);
                    if (get_single_value_result != 0)
                    {
                        result = MU_FAILURE;
                    }
                    else
                    {
                        result = 0;
                    }
                }
            }
        }
    }

    return result;
}